

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void printBlock(char *banner,Integer type,void *ptr,Integer *lo,Integer *hi,Integer *ld)

{
  ulong uVar1;
  long lVar2;
  Integer IVar3;
  double dVar4;
  double dVar5;
  
  uVar1 = pnga_nodeid();
  printf("p[%d] %s lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",uVar1 & 0xffffffff,banner,
         (ulong)(uint)*lo,(ulong)(uint)*hi,(ulong)*(uint *)(lo + 1),(int)hi[1]);
  printf("    ");
  for (uVar1 = *lo; (long)uVar1 <= *hi; uVar1 = uVar1 + 1) {
    printf(" %12d",uVar1 & 0xffffffff);
  }
  putchar(10);
  uVar1 = lo[1];
  do {
    if (hi[1] < (long)uVar1) {
      puts("\n");
      return;
    }
    printf("J: %d",uVar1 & 0xffffffff);
    for (IVar3 = *lo; IVar3 <= *hi; IVar3 = IVar3 + 1) {
      if (4 < type - 0x3ebU) {
switchD_0012e616_caseD_3ed:
        pnga_error("ga_matmul_basic: wrong data type",type);
        goto LAB_0012e677;
      }
      lVar2 = ((uVar1 - lo[1]) * *ld - *lo) + IVar3;
      switch(type) {
      case 0x3eb:
        dVar4 = (double)*(float *)((long)ptr + lVar2 * 4);
        break;
      case 0x3ec:
        dVar4 = *(double *)((long)ptr + lVar2 * 8);
        break;
      case 0x3ed:
        goto switchD_0012e616_caseD_3ed;
      case 0x3ee:
        dVar4 = (double)*(float *)((long)ptr + lVar2 * 8);
        dVar5 = (double)*(float *)((long)ptr + lVar2 * 8 + 4);
        goto LAB_0012e656;
      case 0x3ef:
        dVar4 = *(double *)((long)ptr + lVar2 * 0x10);
        dVar5 = *(double *)((long)ptr + lVar2 * 0x10 + 8);
LAB_0012e656:
        printf(" [%12.4f:%12.4f]",dVar4,dVar5);
        goto LAB_0012e677;
      }
      printf(" %12.4f",dVar4);
LAB_0012e677:
    }
    putchar(10);
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

void printBlock(char * banner, Integer type, void *ptr, Integer lo[],
    Integer hi[], Integer ld[])
{
  Integer i,j;
  Integer offset;
  printf("p[%d] %s lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",
      (int)pnga_nodeid(),banner,(int)lo[0],(int)hi[0],(int)lo[1],(int)hi[1]);
  printf("    ");
  for (i=lo[0]; i<=hi[0]; i++) printf(" %12d",(int)i);
  printf("\n");
  for (j=lo[1]; j<=hi[1]; j++) {
    printf("J: %d",(int)j);
    for (i=lo[0]; i<=hi[0]; i++) {
      offset = (j-lo[1])*ld[0] + i-lo[0];
      switch (type) {
        case C_FLOAT:
          printf(" %12.4f",*((float*)ptr+offset));
          break;
        case C_DBL:
          printf(" %12.4f",*((double*)ptr+offset));
          break;
        case C_DCPL:
          printf(" [%12.4f:%12.4f]",*((double*)ptr+2*offset),
              *((double*)ptr+2*offset+1));
          break;
        case C_SCPL:
          printf(" [%12.4f:%12.4f]",*((float*)ptr+2*offset),
              *((float*)ptr+2*offset+1));
          break;
        default:
          pnga_error("ga_matmul_basic: wrong data type", type);
      }
    }
    printf("\n");
  }
  printf("\n\n");
}